

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operations.hpp
# Opt level: O1

rt_expression_interface<double> *
viennamath::diff_impl<viennamath::rt_expression_interface<double>,double>(void)

{
  expression_not_differentiable_exception *this;
  string local_40;
  
  this = (expression_not_differentiable_exception *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"modulus operation not differentiable!","");
  expression_not_differentiable_exception::expression_not_differentiable_exception(this,&local_40);
  __cxa_throw(this,&expression_not_differentiable_exception::typeinfo,
              expression_not_differentiable_exception::~expression_not_differentiable_exception);
}

Assistant:

InterfaceType * diff_impl(const InterfaceType * /*e*/, op_fabs<NumericT>, const InterfaceType * /*diff_var*/)
  {
    throw expression_not_differentiable_exception("modulus operation not differentiable!");
    return NULL;  //TODO: Think about returning a piecewise function here?
  }